

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall Renderer::RenderContext::RenderContext(RenderContext *this,Module *mod)

{
  DefaultApu *this_00;
  Module *mod_00;
  
  this->mod = mod;
  this->stepping = false;
  this->step = false;
  (this->song).super___shared_ptr<trackerboy::Song,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->song).super___shared_ptr<trackerboy::Song,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->apu;
  trackerboy::DefaultApu::DefaultApu(this_00);
  trackerboy::Synth::Synth(&this->synth,&this_00->super_Apu,0xac44,59.7);
  mod_00 = Module::data(mod);
  trackerboy::Engine::Engine(&this->engine,(IApuIo *)this_00,mod_00);
  trackerboy::InstrumentPreview::InstrumentPreview(&this->ip);
  this->previewState = none;
  this->previewChannel = ch1;
  (this->currentEngineFrame).halted = true;
  *(undefined8 *)&(this->currentEngineFrame).startedNewRow = 0;
  (this->currentEngineFrame).order = 0;
  (this->currentEngineFrame).row = 0;
  this->state = stopped;
  *(undefined8 *)&this->stopCounter = 0;
  *(undefined8 *)((long)&this->bufferSize + 4) = 0;
  *(undefined8 *)((long)&(this->watchdog).__d.__r + 4) = 0;
  *(undefined8 *)((long)&(this->lastPeriod).__d.__r + 4) = 0;
  (this->periodTime).__r = 0;
  this->writesSinceLastPeriod = 0;
  return;
}

Assistant:

Renderer::RenderContext::RenderContext(Module &mod) :
    mod(mod),
    stepping(false),
    step(false),
    song(nullptr),
    apu(),
    synth(apu, 44100),
    engine(apu, &mod.data()),
    ip(),
    previewState(PreviewState::none),
    previewChannel(trackerboy::ChType::ch1),
    state(State::stopped),
    stopCounter(0),
    bufferSize(0),
    watchdog(),
    lastPeriod(),
    periodTime(0),
    writesSinceLastPeriod(0)
{
}